

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageSorters.cpp
# Opt level: O2

void __thiscall FIX::message_order::setOrder(message_order *this,int *order,int size)

{
  int *piVar1;
  int *piVar2;
  int iVar3;
  ulong uVar4;
  shared_array<int> local_30;
  
  if (0 < size) {
    iVar3 = *order;
    this->m_delim = iVar3;
    this->m_largest = iVar3;
    for (uVar4 = 1; (uint)size != uVar4; uVar4 = uVar4 + 1) {
      if (iVar3 <= order[uVar4]) {
        iVar3 = order[uVar4];
      }
      this->m_largest = iVar3;
    }
    shared_array<int>::create(&local_30,(long)(iVar3 + 1));
    shared_array<int>::operator=(&this->m_groupOrder,&local_30);
    shared_array<int>::~shared_array(&local_30);
    piVar2 = (this->m_groupOrder).m_buffer;
    uVar4 = 0;
    while ((uint)size != uVar4) {
      piVar1 = order + uVar4;
      uVar4 = uVar4 + 1;
      piVar2[(long)*piVar1 + 3] = (int)uVar4;
    }
  }
  return;
}

Assistant:

void message_order::setOrder(const int order[], int size) {
  if (size < 1) {
    return;
  }
  m_largest = m_delim = order[0];

  // collect all fields and find the largest field number
  for (int i = 1; i < size; ++i) {
    int field = order[i];
    m_largest = m_largest > field ? m_largest : field;
  }

  m_groupOrder = shared_array<int>::create(m_largest + 1);
  for (int i = 0; i < size; ++i) {
    m_groupOrder[order[i]] = i + 1;
  }
}